

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QDockAreaLayoutItem>::begin(QList<QDockAreaLayoutItem> *this)

{
  QDockAreaLayoutItem *n;
  QArrayDataPointer<QDockAreaLayoutItem> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QDockAreaLayoutItem> *)0x582449);
  QArrayDataPointer<QDockAreaLayoutItem>::operator->(in_RDI);
  n = QArrayDataPointer<QDockAreaLayoutItem>::begin
                ((QArrayDataPointer<QDockAreaLayoutItem> *)0x58245a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }